

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O3

bool __thiscall
HawkTracer::parser::KlassRegister::klass_exists(KlassRegister *this,HT_EventKlassId klass_id)

{
  int iVar1;
  const_iterator cVar2;
  undefined8 uVar3;
  HT_EventKlassId local_1c;
  
  local_1c = klass_id;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    cVar2 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->_register)._M_h,&local_1c);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return cVar2.
           super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false>
           ._M_cur != (__node_type *)0x0;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

bool KlassRegister::klass_exists(HT_EventKlassId klass_id) const
{
    lock_guard l(_register_mtx);
    return _register.find(klass_id) != _register.end();
}